

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationInvarianceTests.cpp
# Opt level: O0

TestInstance * __thiscall
vkt::tessellation::anon_unknown_0::PrimitiveSetInvariance::InvarianceTestCase::createInstance
          (InvarianceTestCase *this,Context *context)

{
  Context *context_local;
  InvarianceTestCase *this_local;
  
  switch((this->m_caseDef).caseType) {
  case CASETYPE_INVARIANT_PRIMITIVE_SET:
    this_local = (InvarianceTestCase *)operator_new(0x28);
    InvariantPrimitiveSetTestInstance::InvariantPrimitiveSetTestInstance
              ((InvariantPrimitiveSetTestInstance *)this_local,context,&this->m_caseDef);
    break;
  case CASETYPE_INVARIANT_TRIANGLE_SET:
    this_local = (InvarianceTestCase *)operator_new(0x28);
    InvariantTriangleSetTestInstance::InvariantTriangleSetTestInstance
              ((InvariantTriangleSetTestInstance *)this_local,context,&this->m_caseDef);
    break;
  case CASETYPE_INVARIANT_OUTER_TRIANGLE_SET:
    this_local = (InvarianceTestCase *)operator_new(0x28);
    InvariantOuterTriangleSetTestInstance::InvariantOuterTriangleSetTestInstance
              ((InvariantOuterTriangleSetTestInstance *)this_local,context,&this->m_caseDef);
    break;
  case CASETYPE_INVARIANT_INNER_TRIANGLE_SET:
    this_local = (InvarianceTestCase *)operator_new(0x28);
    InvariantInnerTriangleSetTestInstance::InvariantInnerTriangleSetTestInstance
              ((InvariantInnerTriangleSetTestInstance *)this_local,context,&this->m_caseDef);
    break;
  default:
    this_local = (InvarianceTestCase *)0x0;
  }
  return (TestInstance *)this_local;
}

Assistant:

TestInstance* InvarianceTestCase::createInstance (Context& context) const
{
	switch (m_caseDef.caseType)
	{
		case CASETYPE_INVARIANT_PRIMITIVE_SET:			return new InvariantPrimitiveSetTestInstance    (context, m_caseDef);
		case CASETYPE_INVARIANT_TRIANGLE_SET:			return new InvariantTriangleSetTestInstance     (context, m_caseDef);
		case CASETYPE_INVARIANT_OUTER_TRIANGLE_SET:		return new InvariantOuterTriangleSetTestInstance(context, m_caseDef);
		case CASETYPE_INVARIANT_INNER_TRIANGLE_SET:		return new InvariantInnerTriangleSetTestInstance(context, m_caseDef);
		default:
			DE_ASSERT(false);
			return DE_NULL;
	}
}